

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-nice-strict.h
# Opt level: O3

void __thiscall
testing::StrictMock<bssl::(anonymous_namespace)::MockCertIssuerSource>::StrictMock
          (StrictMock<bssl::(anonymous_namespace)::MockCertIssuerSource> *this)

{
  FunctionMocker<void_(const_bssl::ParsedCertificate_*,_std::vector<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>_*)>
  *this_00;
  
  Mock::FailUninterestingCalls((uintptr_t)this);
  this_00 = &(this->super_MockCertIssuerSource).gmock02_SyncGetIssuersOf_1833;
  memset(this_00,0,0x90);
  (this->super_MockCertIssuerSource).super_CertIssuerSource._vptr_CertIssuerSource =
       (_func_int **)&PTR__MockCertIssuerSource_006c1ec8;
  internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
            (&this_00->super_UntypedFunctionMockerBase);
  (this->super_MockCertIssuerSource).gmock02_SyncGetIssuersOf_1833.super_UntypedFunctionMockerBase.
  _vptr_UntypedFunctionMockerBase = (_func_int **)&PTR__FunctionMocker_006c2f68;
  internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
            (&(this->super_MockCertIssuerSource).gmock02_AsyncGetIssuersOf_1835.
              super_UntypedFunctionMockerBase);
  (this->super_MockCertIssuerSource).gmock02_AsyncGetIssuersOf_1835.super_UntypedFunctionMockerBase.
  _vptr_UntypedFunctionMockerBase = (_func_int **)&PTR__FunctionMocker_006c3158;
  (this->super_MockCertIssuerSource).super_CertIssuerSource._vptr_CertIssuerSource =
       (_func_int **)&PTR__StrictMock_006c1e38;
  return;
}

Assistant:

StrictMock() : MockClass() {
    static_assert(sizeof(*this) == sizeof(MockClass),
                  "The impl subclass shouldn't introduce any padding");
  }